

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_valddi.cpp
# Opt level: O2

ze_result_t __thiscall
validation_layer::zetDebugWriteMemory
          (validation_layer *this,zet_debug_session_handle_t hDebug,ze_device_thread_t thread,
          zet_debug_memory_space_desc_t *desc,size_t size,void *buffer)

{
  Logger *this_00;
  long *plVar1;
  ze_result_t result;
  ze_result_t zVar2;
  undefined8 uVar3;
  long lVar4;
  size_t i;
  long lVar5;
  long lVar6;
  ze_device_thread_t thread_00;
  allocator local_71;
  zet_debug_memory_space_desc_t *local_70;
  zet_debug_memory_space_desc_t *local_68;
  void *local_60;
  code *local_58;
  string local_50;
  
  lVar6 = context;
  local_70 = thread._8_8_;
  uVar3 = thread._0_8_;
  this_00 = *(Logger **)(context + 0xd50);
  local_68 = desc;
  local_60 = (void *)size;
  std::__cxx11::string::string
            ((string *)&local_50,"zetDebugWriteMemory(hDebug, thread, desc, size, buffer)",&local_71
            );
  loader::Logger::log_trace(this_00,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (*(code **)(lVar6 + 0x860) == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar4 = *(long *)(lVar6 + 0xd38) - *(long *)(lVar6 + 0xd30) >> 3;
    lVar5 = 0;
    local_58 = *(code **)(lVar6 + 0x860);
    do {
      if (lVar4 == lVar5) {
        if ((*(char *)(context + 4) != '\x01') ||
           (thread_00.eu = (int)uVar3, thread_00.thread = (int)((ulong)uVar3 >> 0x20),
           thread_00._0_8_ = hDebug,
           result = ZETHandleLifetimeValidation::zetDebugWriteMemoryPrologue
                              ((ZETHandleLifetimeValidation *)(*(long *)(context + 0xd48) + 0x10),
                               (zet_debug_session_handle_t)this,thread_00,local_70,(size_t)local_68,
                               local_60), result == ZE_RESULT_SUCCESS)) {
          zVar2 = (*local_58)(this,hDebug,uVar3,local_70,local_68,local_60);
          lVar6 = 0;
          goto LAB_00160c43;
        }
        break;
      }
      plVar1 = *(long **)(*(long *)(*(long *)(context + 0xd30) + lVar5 * 8) + 0x10);
      result = (**(code **)(*plVar1 + 0x90))(plVar1,this,hDebug,uVar3,local_70,local_68,local_60);
      lVar5 = lVar5 + 1;
    } while (result == ZE_RESULT_SUCCESS);
  }
  goto LAB_00160c90;
  while( true ) {
    plVar1 = *(long **)(*(long *)(*(long *)(context + 0xd30) + lVar6 * 8) + 0x10);
    result = (**(code **)(*plVar1 + 0x98))
                       (plVar1,this,hDebug,uVar3,local_70,local_68,local_60,zVar2);
    lVar6 = lVar6 + 1;
    if (result != ZE_RESULT_SUCCESS) break;
LAB_00160c43:
    result = zVar2;
    if (lVar4 == lVar6) break;
  }
LAB_00160c90:
  logAndPropagateResult("zetDebugWriteMemory",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetDebugWriteMemory(
        zet_debug_session_handle_t hDebug,              ///< [in] debug session handle
        ze_device_thread_t thread,                      ///< [in] the thread identifier.
        const zet_debug_memory_space_desc_t* desc,      ///< [in] memory space descriptor
        size_t size,                                    ///< [in] the number of bytes to write
        const void* buffer                              ///< [in] a buffer holding the pattern to write
        )
    {
        context.logger->log_trace("zetDebugWriteMemory(hDebug, thread, desc, size, buffer)");

        auto pfnWriteMemory = context.zetDdiTable.Debug.pfnWriteMemory;

        if( nullptr == pfnWriteMemory )
            return logAndPropagateResult("zetDebugWriteMemory", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zetValidation->zetDebugWriteMemoryPrologue( hDebug, thread, desc, size, buffer );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zetDebugWriteMemory", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zetHandleLifetime.zetDebugWriteMemoryPrologue( hDebug, thread, desc, size, buffer );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zetDebugWriteMemory", result);
        }

        auto driver_result = pfnWriteMemory( hDebug, thread, desc, size, buffer );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zetValidation->zetDebugWriteMemoryEpilogue( hDebug, thread, desc, size, buffer ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zetDebugWriteMemory", result);
        }

        return logAndPropagateResult("zetDebugWriteMemory", driver_result);
    }